

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void> *
pybind11::detail::load_type<std::__cxx11::string,void>
          (type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
           *conv,handle *handle)

{
  bool bVar1;
  cast_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  PyObject *local_d8;
  PyObject *local_d0;
  str local_c8;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  PyObject *local_20;
  handle *local_18;
  handle *handle_local;
  type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  *conv_local;
  
  local_20 = handle->m_ptr;
  local_18 = handle;
  handle_local = (handle *)conv;
  bVar1 = string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
          ::load(&conv->
                  super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                 ,(handle)local_20,true);
  if (!bVar1) {
    this = (cast_error *)__cxa_allocate_exception(0x10);
    local_d8 = local_18->m_ptr;
    local_d0 = (PyObject *)pybind11::type::handle_of((handle)local_d8);
    pybind11::str::str(&local_c8,(handle)local_d0);
    pybind11::str::operator_cast_to_string(&local_c0,&local_c8);
    std::operator+(&local_a0,"Unable to cast Python instance of type ",&local_c0);
    std::operator+(&local_80,&local_a0," to C++ type \'");
    type_id<std::__cxx11::string>();
    std::operator+(&local_60,&local_80,&local_108);
    std::operator+(&local_40,&local_60,"\'");
    cast_error::runtime_error(this,&local_40);
    __cxa_throw(this,&cast_error::typeinfo,cast_error::~cast_error);
  }
  return (type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
          *)handle_local;
}

Assistant:

type_caster<T, SFINAE> &load_type(type_caster<T, SFINAE> &conv, const handle &handle) {
    if (!conv.load(handle, true)) {
#if defined(NDEBUG)
        throw cast_error("Unable to cast Python instance to C++ type (compile in debug mode for details)");
#else
        throw cast_error("Unable to cast Python instance of type " +
            (std::string) str(type::handle_of(handle)) + " to C++ type '" + type_id<T>() + "'");
#endif
    }
    return conv;
}